

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O0

int __thiscall rw::PluginList::close(PluginList *this,int __fd)

{
  LLLink *pLVar1;
  bool32 bVar2;
  LLLink *pLVar3;
  undefined4 in_register_00000034;
  LLLink *local_28;
  LLLink *lnk;
  LLLink *_next;
  Plugin *p;
  PluginList *l;
  
  local_28 = allPlugins;
  while( true ) {
    pLVar1 = local_28->next;
    pLVar3 = LinkList::end((LinkList *)&allPlugins);
    if (local_28 == pLVar3) break;
    pLVar3 = local_28[-2].prev;
    LLLink::remove(local_28 + -1,(char *)CONCAT44(in_register_00000034,__fd));
    LLLink::remove(local_28,(char *)CONCAT44(in_register_00000034,__fd));
    (*DAT_001685f8)(&local_28[-7].prev);
    bVar2 = LinkList::isEmpty((LinkList *)&pLVar3->prev);
    local_28 = pLVar1;
    if (bVar2 != 0) {
      *(undefined4 *)&pLVar3->next = *(undefined4 *)((long)&pLVar3->next + 4);
    }
  }
  return (int)local_28;
}

Assistant:

void
PluginList::close(void)
{
	PluginList *l;
	Plugin *p;
	FORLIST(lnk, allPlugins){
		p = LLLinkGetData(lnk, Plugin, inGlobalList);
		l = p->parentList;
		p->inParentList.remove();
		p->inGlobalList.remove();
		rwFree(p);
		if(l->plugins.isEmpty())
			l->size = l->defaultSize;
	}
	assert(allPlugins.isEmpty());
}